

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::SGXMLScanner::laxElementValidation
          (SGXMLScanner *this,QName *element,ContentLeafNameTypeVector *cv,XMLContentModel *cm,
          XMLSize_t parentElemDepth)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  NodeTypes NVar5;
  uint uVar6;
  XMLSize_t XVar7;
  QName *exemplar;
  XMLSize_t pos;
  bool bVar8;
  SubstitutionGroupComparator comparator;
  SubstitutionGroupComparator local_40;
  
  uVar1 = this->fElemState[parentElemDepth];
  if (uVar1 != 0xffffffff) {
    uVar2 = element->fURIId;
    uVar3 = this->fElemLoopState[parentElemDepth];
    local_40.fGrammarResolver = (this->super_XMLScanner).fGrammarResolver;
    local_40.fStringPool = (this->super_XMLScanner).fURIStringPool;
    if (cv != (ContentLeafNameTypeVector *)0x0) {
      XVar7 = ContentLeafNameTypeVector::getLeafCount(cv);
      for (pos = 0; XVar7 != pos; pos = pos + 1) {
        exemplar = ContentLeafNameTypeVector::getLeafNameAt(cv,pos);
        uVar6 = exemplar->fURIId;
        NVar5 = ContentLeafNameTypeVector::getLeafTypeAt(cv,pos);
        if (NVar5 == Leaf) {
          if (((uVar6 == uVar2) &&
              (bVar8 = XMLString::equals(exemplar->fLocalPart,element->fLocalPart), bVar8)) ||
             (bVar8 = SubstitutionGroupComparator::isEquivalentTo(&local_40,element,exemplar), bVar8
             )) goto LAB_002b5d2f;
        }
        else {
          NVar5 = NVar5 & (Any_NS|Any_Other);
          if (NVar5 == Any_NS) {
            if (uVar6 == uVar2) goto LAB_002b5d2f;
          }
          else if (NVar5 == Any_Other) {
            if ((uVar6 != uVar2) && (uVar2 != (this->super_XMLScanner).fEmptyNamespaceId))
            goto LAB_002b5d2f;
          }
          else if (NVar5 == Any) {
LAB_002b5d2f:
            uVar6 = (*cm->_vptr_XMLContentModel[6])(cm,(ulong)uVar1,pos);
            if (uVar6 != 0xffffffff) {
              if (XVar7 != pos) {
                NVar5 = ContentLeafNameTypeVector::getLeafTypeAt(cv,pos);
                if ((uint)((NVar5 & (Any_NS|Any_Other)) + ~Sequence) < 3) {
                  if ((uint)(NVar5 + ~(ModelGroupChoice|ZeroOrOne)) < 3) {
                    bVar4 = true;
                    bVar8 = false;
                    goto LAB_002b5dbe;
                  }
                  bVar8 = (uint)(NVar5 + ~ModelGroupSequence) < 3;
                }
                else {
                  bVar8 = false;
                }
                bVar4 = false;
LAB_002b5dbe:
                this->fElemState[parentElemDepth] = uVar6;
                this->fElemLoopState[parentElemDepth] = uVar3;
                if (!bVar4) {
                  return bVar8;
                }
                (this->super_XMLScanner).fValidate = false;
                (this->super_XMLScanner).fElemStack.fStack
                [(this->super_XMLScanner).fElemStack.fStackTop - 1]->fValidationFlag = false;
                return bVar8;
              }
              break;
            }
          }
        }
      }
      this->fElemState[parentElemDepth] = 0xffffffff;
      this->fElemLoopState[parentElemDepth] = 0;
    }
  }
  return false;
}

Assistant:

bool SGXMLScanner::laxElementValidation(QName* element, ContentLeafNameTypeVector* cv,
                                        const XMLContentModel* const cm,
                                        const XMLSize_t parentElemDepth)
{
    bool skipThisOne = false;
    bool laxThisOne = false;
    unsigned int elementURI = element->getURI();
    unsigned int currState = fElemState[parentElemDepth];
    unsigned int currLoop = fElemLoopState[parentElemDepth];

    if (currState == XMLContentModel::gInvalidTrans) {
        return laxThisOne;
    }

    SubstitutionGroupComparator comparator(fGrammarResolver, fURIStringPool);

    if (cv) {
        XMLSize_t i = 0;
        XMLSize_t leafCount = cv->getLeafCount();
        unsigned int nextState = 0;

        for (; i < leafCount; i++) {

            QName* fElemMap = cv->getLeafNameAt(i);
            unsigned int uri = fElemMap->getURI();
            ContentSpecNode::NodeTypes type = cv->getLeafTypeAt(i);

            if (type == ContentSpecNode::Leaf) {
                if (((uri == elementURI)
                      && XMLString::equals(fElemMap->getLocalPart(), element->getLocalPart()))
                    || comparator.isEquivalentTo(element, fElemMap)) {

                    nextState = cm->getNextState(currState, i);

                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            } else if ((type & 0x0f) == ContentSpecNode::Any) {
                nextState = cm->getNextState(currState, i);
                if (nextState != XMLContentModel::gInvalidTrans)
                    break;
            }
            else if ((type & 0x0f) == ContentSpecNode::Any_Other) {
                if (uri != elementURI && elementURI != fEmptyNamespaceId) {
                    nextState = cm->getNextState(currState, i);
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }
            else if ((type & 0x0f) == ContentSpecNode::Any_NS) {
                if (uri == elementURI) {
                    nextState = cm->getNextState(currState, i);
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }

        } // for

        if (i == leafCount) { // no match
            fElemState[parentElemDepth] = XMLContentModel::gInvalidTrans;
            fElemLoopState[parentElemDepth] = 0;
            return laxThisOne;
        }

        ContentSpecNode::NodeTypes type = cv->getLeafTypeAt(i);
        if ((type & 0x0f) == ContentSpecNode::Any ||
            (type & 0x0f) == ContentSpecNode::Any_Other ||
            (type & 0x0f) == ContentSpecNode::Any_NS)
        {
            if (type == ContentSpecNode::Any_Skip ||
                type == ContentSpecNode::Any_NS_Skip ||
                type == ContentSpecNode::Any_Other_Skip) {
                skipThisOne = true;
            }
            else if (type == ContentSpecNode::Any_Lax ||
                     type == ContentSpecNode::Any_NS_Lax ||
                     type == ContentSpecNode::Any_Other_Lax) {
                laxThisOne = true;
            }
        }
        fElemState[parentElemDepth] = nextState;
        fElemLoopState[parentElemDepth] = currLoop;
    } // if

    if (skipThisOne) {
        fValidate = false;
        fElemStack.setValidationFlag(fValidate);
    }

    return laxThisOne;
}